

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::Xor_InPlace
              (Var aLeft,Var aRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Var pvVar4;
  
  bVar1 = TaggedInt::Is(aLeft);
  if (bVar1) {
    uVar2 = TaggedInt::ToInt32(aLeft);
  }
  else {
    uVar2 = JavascriptConversion::ToInt32(aLeft,scriptContext);
  }
  bVar1 = TaggedInt::Is(aRight);
  if (bVar1) {
    uVar3 = TaggedInt::ToInt32(aRight);
  }
  else {
    uVar3 = JavascriptConversion::ToInt32(aRight,scriptContext);
  }
  pvVar4 = JavascriptNumber::ToVarInPlace(uVar3 ^ uVar2,scriptContext,result);
  return pvVar4;
}

Assistant:

Var JavascriptMath::Xor_InPlace(Var aLeft, Var aRight, ScriptContext* scriptContext,  JavascriptNumber* result)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_XorInPlace);
            int32 nLeft = TaggedInt::Is(aLeft) ? TaggedInt::ToInt32(aLeft) : JavascriptConversion::ToInt32(aLeft, scriptContext);
            int32 nRight = TaggedInt::Is(aRight) ? TaggedInt::ToInt32(aRight) : JavascriptConversion::ToInt32(aRight, scriptContext);

            return JavascriptNumber::ToVarInPlace(nLeft ^ nRight, scriptContext, result);
            JIT_HELPER_END(Op_XorInPlace);
        }